

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# formula.cpp
# Opt level: O1

void __thiscall
bal::Formula::add_parameter(Formula *this,string *key,string *name,string *value,bool b_quote)

{
  pointer pcVar1;
  char *pcVar2;
  long *plVar3;
  iterator iVar4;
  undefined3 in_register_00000081;
  string item;
  undefined1 *local_b0 [2];
  undefined1 local_a0 [16];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_90;
  pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_70;
  
  local_b0[0] = local_a0;
  if (CONCAT31(in_register_00000081,b_quote) == 0) {
    pcVar1 = (name->_M_dataplus)._M_p;
    std::__cxx11::string::_M_construct<char*>
              ((string *)local_b0,pcVar1,pcVar1 + name->_M_string_length);
    pcVar2 = (char *)std::__cxx11::string::append((char *)local_b0);
    plVar3 = (long *)std::__cxx11::string::_M_append(pcVar2,(ulong)(value->_M_dataplus)._M_p);
  }
  else {
    pcVar1 = (name->_M_dataplus)._M_p;
    std::__cxx11::string::_M_construct<char*>
              ((string *)local_b0,pcVar1,pcVar1 + name->_M_string_length);
    pcVar2 = (char *)std::__cxx11::string::append((char *)local_b0);
    pcVar2 = (char *)std::__cxx11::string::_M_append(pcVar2,(ulong)(value->_M_dataplus)._M_p);
    plVar3 = (long *)std::__cxx11::string::append(pcVar2);
  }
  local_90._M_dataplus._M_p = (pointer)&local_90.field_2;
  std::__cxx11::string::_M_construct<char*>((string *)&local_90,*plVar3,plVar3[1] + *plVar3);
  if (local_b0[0] != local_a0) {
    operator_delete(local_b0[0]);
  }
  iVar4 = std::
          _Rb_tree<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::less<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
          ::find(&(this->parameters_)._M_t,key);
  if ((_Rb_tree_header *)iVar4._M_node == &(this->parameters_)._M_t._M_impl.super__Rb_tree_header) {
    std::
    pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&,_true>
              (&local_70,key,&local_90);
    std::
    _Rb_tree<std::__cxx11::string_const,std::pair<std::__cxx11::string_const,std::__cxx11::string>,std::_Select1st<std::pair<std::__cxx11::string_const,std::__cxx11::string>>,std::less<std::__cxx11::string_const>,std::allocator<std::pair<std::__cxx11::string_const,std::__cxx11::string>>>
    ::_M_insert_unique<std::pair<std::__cxx11::string_const,std::__cxx11::string>>
              ((_Rb_tree<std::__cxx11::string_const,std::pair<std::__cxx11::string_const,std::__cxx11::string>,std::_Select1st<std::pair<std::__cxx11::string_const,std::__cxx11::string>>,std::less<std::__cxx11::string_const>,std::allocator<std::pair<std::__cxx11::string_const,std::__cxx11::string>>>
                *)&this->parameters_,&local_70);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_70.second._M_dataplus._M_p != &local_70.second.field_2) {
      operator_delete(local_70.second._M_dataplus._M_p);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_70.first._M_dataplus._M_p != &local_70.first.field_2) {
      operator_delete(local_70.first._M_dataplus._M_p);
    }
  }
  else {
    if (iVar4._M_node[2]._M_parent != (_Base_ptr)0x0) {
      std::__cxx11::string::append((char *)(iVar4._M_node + 2));
    }
    std::__cxx11::string::_M_append((char *)(iVar4._M_node + 2),(ulong)local_90._M_dataplus._M_p);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_90._M_dataplus._M_p != &local_90.field_2) {
    operator_delete(local_90._M_dataplus._M_p);
  }
  return;
}

Assistant:

void Formula::add_parameter(const std::string& key, const std::string& name,
                       const std::string& value, const bool b_quote) {
        std::string item = (b_quote) ?
        std::string(name).append(": \"").append(value).append("\"") :
        std::string(name).append(": ").append(value);
        
        auto it = parameters_.find(key);
        if (it != parameters_.end()) {
            if (it->second.size() > 0) {
                it->second.append(", ");
            };
            it->second.append(item);
        } else {
            parameters_.insert({key, item});
        };
    }